

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O3

bool __thiscall spvtools::opt::LoopUtils::FullyUnroll(LoopUtils *this)

{
  Loop *loop;
  bool bVar1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions;
  LoopUnrollerUtilsImpl unroller;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_1f8;
  LoopUnrollerUtilsImpl local_1e0;
  
  bVar1 = CanPerformUnroll(this);
  if (bVar1) {
    local_1f8.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Loop::GetInductionVariables(this->loop_,&local_1f8);
    local_1e0.context_ = this->context_;
    loop = this->loop_;
    local_1e0.function_ = loop->loop_header_->function_;
    memset(&local_1e0.blocks_to_add_,0,0x98);
    local_1e0.state_.new_blocks._M_h._M_bucket_count = 1;
    local_1e0.state_.new_blocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1e0.state_.new_blocks._M_h._M_element_count = 0;
    local_1e0.state_.new_blocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_1e0.state_.new_blocks._M_h._M_rehash_policy._M_next_resize = 0;
    local_1e0.state_.new_blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_1e0.state_.new_inst._M_h._M_buckets = &local_1e0.state_.new_inst._M_h._M_single_bucket;
    local_1e0.state_.new_inst._M_h._M_bucket_count = 1;
    local_1e0.state_.new_inst._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1e0.state_.new_inst._M_h._M_element_count = 0;
    local_1e0.state_.new_inst._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_1e0.state_.new_inst._M_h._M_rehash_policy._M_next_resize = 0;
    local_1e0.state_.new_inst._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_1e0.state_.ids_to_new_inst._M_h._M_buckets =
         &local_1e0.state_.ids_to_new_inst._M_h._M_single_bucket;
    local_1e0.state_.ids_to_new_inst._M_h._M_bucket_count = 1;
    local_1e0.state_.ids_to_new_inst._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1e0.state_.ids_to_new_inst._M_h._M_element_count = 0;
    local_1e0.state_.ids_to_new_inst._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_1e0.state_.ids_to_new_inst._M_h._M_rehash_policy._M_next_resize = 0;
    local_1e0.state_.ids_to_new_inst._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_1e0.loop_blocks_inorder_.
    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e0.loop_blocks_inorder_.
    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e0.loop_blocks_inorder_.
    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e0.loop_condition_block_ = (BasicBlock *)0x0;
    local_1e0.loop_induction_variable_ = (Instruction *)0x0;
    local_1e0.loop_phi_instructions_.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e0.loop_phi_instructions_.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e0.loop_phi_instructions_.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e0.number_of_loop_iterations_ = 0;
    local_1e0.loop_step_value_ = 0;
    local_1e0.loop_init_value_ = 0;
    local_1e0.state_.new_blocks._M_h._M_buckets = &local_1e0.state_.new_blocks._M_h._M_single_bucket
    ;
    anon_unknown_0::LoopUnrollerUtilsImpl::Init(&local_1e0,loop);
    anon_unknown_0::LoopUnrollerUtilsImpl::FullyUnroll(&local_1e0,this->loop_);
    anon_unknown_0::LoopUnrollerUtilsImpl::~LoopUnrollerUtilsImpl(&local_1e0);
    if (local_1f8.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar1;
}

Assistant:

bool LoopUtils::FullyUnroll() {
  if (!CanPerformUnroll()) return false;

  std::vector<Instruction*> inductions;
  loop_->GetInductionVariables(inductions);

  LoopUnrollerUtilsImpl unroller{context_,
                                 loop_->GetHeaderBlock()->GetParent()};

  unroller.Init(loop_);
  unroller.FullyUnroll(loop_);

  return true;
}